

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int QEMU_AES_set_decrypt_key(uchar *userKey,int bits,AES_KEY *key)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint32_t *puVar8;
  int iVar9;
  
  iVar4 = QEMU_AES_set_encrypt_key(userKey,bits,key);
  if (-1 < iVar4) {
    if (0 < key->rounds) {
      lVar7 = 0;
      lVar6 = (long)(key->rounds << 2);
      do {
        lVar5 = lVar6 + -4;
        uVar1 = key->rd_key[lVar7];
        key->rd_key[lVar7] = key->rd_key[lVar6];
        key->rd_key[lVar6] = uVar1;
        uVar1 = key->rd_key[lVar7 + 1];
        key->rd_key[lVar7 + 1] = key->rd_key[lVar6 + 1];
        key->rd_key[lVar6 + 1] = uVar1;
        uVar1 = key->rd_key[lVar7 + 2];
        key->rd_key[lVar7 + 2] = key->rd_key[lVar6 + 2];
        key->rd_key[lVar6 + 2] = uVar1;
        uVar1 = key->rd_key[lVar7 + 3];
        key->rd_key[lVar7 + 3] = key->rd_key[lVar6 + 3];
        key->rd_key[lVar6 + 3] = uVar1;
        lVar7 = lVar7 + 4;
        lVar6 = lVar5;
      } while (lVar7 < lVar5);
    }
    iVar4 = 0;
    if (1 < key->rounds) {
      puVar8 = key->rd_key + 7;
      iVar9 = 1;
      do {
        uVar2 = puVar8[-3];
        uVar3 = puVar8[-2];
        puVar8[-3] = AES_Td1[*(byte *)((long)AES_Te4 + (ulong)(uVar2 >> 0xe & 0x3fc))] ^
                     AES_Td0[(byte)AES_Te4[uVar2 >> 0x18]] ^
                     AES_Td2[(byte)AES_Te4[uVar2 >> 8 & 0xff]] ^
                     AES_Td3[(byte)AES_Te4[uVar2 & 0xff]];
        puVar8[-2] = AES_Td1[*(byte *)((long)AES_Te4 + (ulong)(uVar3 >> 0xe & 0x3fc))] ^
                     AES_Td0[(byte)AES_Te4[uVar3 >> 0x18]] ^
                     AES_Td2[(byte)AES_Te4[uVar3 >> 8 & 0xff]] ^
                     AES_Td3[(byte)AES_Te4[uVar3 & 0xff]];
        uVar2 = puVar8[-1];
        puVar8[-1] = AES_Td1[*(byte *)((long)AES_Te4 + (ulong)(uVar2 >> 0xe & 0x3fc))] ^
                     AES_Td0[(byte)AES_Te4[uVar2 >> 0x18]] ^
                     AES_Td2[(byte)AES_Te4[uVar2 >> 8 & 0xff]] ^
                     AES_Td3[(byte)AES_Te4[uVar2 & 0xff]];
        uVar2 = *puVar8;
        *puVar8 = AES_Td1[*(byte *)((long)AES_Te4 + (ulong)(uVar2 >> 0xe & 0x3fc))] ^
                  AES_Td0[(byte)AES_Te4[uVar2 >> 0x18]] ^ AES_Td2[(byte)AES_Te4[uVar2 >> 8 & 0xff]]
                  ^ AES_Td3[(byte)AES_Te4[uVar2 & 0xff]];
        iVar9 = iVar9 + 1;
        puVar8 = puVar8 + 4;
      } while (iVar9 < key->rounds);
    }
  }
  return iVar4;
}

Assistant:

int AES_set_decrypt_key(const unsigned char *userKey, const int bits,
                         AES_KEY *key) {

        u32 *rk;
        int i, j, status;
        u32 temp;

        /* first, start with an encryption schedule */
        status = AES_set_encrypt_key(userKey, bits, key);
        if (status < 0)
                return status;

        rk = key->rd_key;

        /* invert the order of the round keys: */
        for (i = 0, j = 4*(key->rounds); i < j; i += 4, j -= 4) {
                temp = rk[i    ]; rk[i    ] = rk[j    ]; rk[j    ] = temp;
                temp = rk[i + 1]; rk[i + 1] = rk[j + 1]; rk[j + 1] = temp;
                temp = rk[i + 2]; rk[i + 2] = rk[j + 2]; rk[j + 2] = temp;
                temp = rk[i + 3]; rk[i + 3] = rk[j + 3]; rk[j + 3] = temp;
        }
        /* apply the inverse MixColumn transform to all round keys but the first and the last: */
        for (i = 1; i < (key->rounds); i++) {
                rk += 4;
                rk[0] =
                        AES_Td0[AES_Te4[(rk[0] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[0] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[0] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[0]      ) & 0xff] & 0xff];
                rk[1] =
                        AES_Td0[AES_Te4[(rk[1] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[1] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[1] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[1]      ) & 0xff] & 0xff];
                rk[2] =
                        AES_Td0[AES_Te4[(rk[2] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[2] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[2] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[2]      ) & 0xff] & 0xff];
                rk[3] =
                        AES_Td0[AES_Te4[(rk[3] >> 24)       ] & 0xff] ^
                        AES_Td1[AES_Te4[(rk[3] >> 16) & 0xff] & 0xff] ^
                        AES_Td2[AES_Te4[(rk[3] >>  8) & 0xff] & 0xff] ^
                        AES_Td3[AES_Te4[(rk[3]      ) & 0xff] & 0xff];
        }
        return 0;
}